

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Any_data _Var1;
  bool bVar2;
  int iVar3;
  void *__dest;
  size_type sVar4;
  mapped_type *pmVar5;
  long *plVar6;
  allocator local_c2;
  allocator local_c1;
  int payloadLength;
  int captureId;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  bool isInitialized;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  _Any_data __tmp;
  _Any_data __tmp_1;
  
  printf("Usage: %s [-cN] [-lN]\n",*argv);
  puts("    -cN - select capture device N");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  putchar(10);
  __dest = (void *)GGWave::Protocols::rx();
  memcpy(__dest,&PTR_anon_var_dwarf_5adf_00107bf0,0x160);
  parseCmdArguments_abi_cxx11_((int)&argm,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string((string *)local_b8._M_pod_data,"c",(allocator *)&payloadLength);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&argm,(key_type *)&local_b8);
  if (sVar4 == 0) {
    iVar3 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&isInitialized,"c",&local_c2);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&argm,(key_type *)&isInitialized);
    iVar3 = std::__cxx11::stoi(pmVar5,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&isInitialized);
  }
  std::__cxx11::string::~string((string *)local_b8._M_pod_data);
  captureId = iVar3;
  std::__cxx11::string::string((string *)local_b8._M_pod_data,"l",&local_c2);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&argm,(key_type *)&local_b8);
  if (sVar4 == 0) {
    iVar3 = 0x10;
  }
  else {
    std::__cxx11::string::string((string *)&isInitialized,"l",&local_c1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&argm,(key_type *)&isInitialized);
    iVar3 = std::__cxx11::stoi(pmVar5,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&isInitialized);
  }
  std::__cxx11::string::~string((string *)local_b8._M_pod_data);
  isInitialized = false;
  local_a8 = (_Manager_type)0x0;
  p_Stack_a0 = (_Invoker_type)0x0;
  local_b8 = (_Any_data)ZEXT816(0);
  payloadLength = iVar3;
  plVar6 = (long *)operator_new(0x18);
  *plVar6 = (long)&captureId;
  plVar6[1] = (long)&payloadLength;
  plVar6[2] = (long)&isInitialized;
  local_a8 = g_doInit.super__Function_base._M_manager;
  local_b8._M_unused._M_object = plVar6;
  _Var1 = local_b8;
  local_b8 = g_doInit.super__Function_base._M_functor;
  g_doInit.super__Function_base._M_functor = _Var1;
  g_doInit.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:351:16)>
       ::_M_manager;
  p_Stack_a0 = g_doInit._M_invoker;
  g_doInit._M_invoker =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:351:16)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  local_a8 = g_mainUpdate.super__Function_base._M_manager;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = &isInitialized;
  _Var1 = local_b8;
  local_b8 = g_mainUpdate.super__Function_base._M_functor;
  g_mainUpdate.super__Function_base._M_functor = _Var1;
  g_mainUpdate.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:363:20)>
       ::_M_manager;
  p_Stack_a0 = g_mainUpdate._M_invoker;
  g_mainUpdate._M_invoker =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:363:20)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  bVar2 = std::function<bool_()>::operator()(&g_doInit);
  if (bVar2) {
    do {
      local_b8._M_unused._M_member_pointer = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_b8);
      bVar2 = std::function<bool_()>::operator()(&g_mainUpdate);
    } while (bVar2);
    GGWave_deinit();
    SDL_CloseAudio();
    iVar3 = 0;
    SDL_Quit();
  }
  else {
    puts("Error: failed to initialize audio");
    iVar3 = -2;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&argm);
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#else
    printf("Usage: %s [-cN] [-lN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");
#endif

    GGWave::Protocols::rx() = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm = parseCmdArguments(argc, argv);
    const int captureId = argm.count("c") == 0 ? 0 : std::stoi(argm.at("c"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    bool isInitialized = false;

    g_doInit = [&]() {
        if (GGWave_init(0, captureId, payloadLength, 0, true) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

        isInitialized = true;
        printf("Listening for payload with length = %d bytes ..\n", payloadLength);

        return true;
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        GGWave_mainLoop();

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
        if (g_mainUpdate() == false) break;
    }

    GGWave_deinit();

    // Cleanup
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}